

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O0

bool __thiscall
cmCTestCurl::HttpRequest(cmCTestCurl *this,string *url,string *fields,string *response)

{
  undefined1 *puVar1;
  cmCTest *pcVar2;
  CURL *pCVar3;
  bool bVar4;
  ostream *poVar5;
  char *pcVar6;
  undefined8 uVar7;
  size_type sVar8;
  string local_8e0 [32];
  undefined1 local_8c0 [8];
  ostringstream cmCTestLog_msg_4;
  string local_748 [32];
  undefined1 local_728 [8];
  ostringstream cmCTestLog_msg_3;
  allocator<char> local_5a9;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_5a8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_5a0;
  string local_598 [8];
  string curlDebug;
  undefined1 local_558 [8];
  ostringstream cmCTestLog_msg_2;
  allocator<char> local_3d9;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_3d8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_3d0;
  string local_3c8 [36];
  CURLcode local_3a4;
  undefined1 local_3a0 [4];
  CURLcode res;
  vector<char,_std::allocator<char>_> debugData;
  vector<char,_std::allocator<char>_> responseData;
  ostringstream local_350 [8];
  ostringstream cmCTestLog_msg_1;
  string local_1d8 [48];
  ostringstream local_1a8 [8];
  ostringstream cmCTestLog_msg;
  string *response_local;
  string *fields_local;
  string *url_local;
  cmCTestCurl *this_local;
  
  std::__cxx11::string::operator=((string *)response,"");
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar5 = std::operator<<((ostream *)local_1a8,"HttpRequest\n");
  poVar5 = std::operator<<(poVar5,"url: ");
  poVar5 = std::operator<<(poVar5,(string *)url);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"fields ");
  poVar5 = std::operator<<(poVar5,(string *)fields);
  std::operator<<(poVar5,"\n");
  pcVar2 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCurl.cxx"
               ,0xd4,pcVar6,false);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  bVar4 = InitCurl(this);
  if (bVar4) {
    curl_easy_setopt(this->Curl,CURLOPT_POST);
    pCVar3 = this->Curl;
    uVar7 = std::__cxx11::string::c_str();
    curl_easy_setopt(pCVar3,CURLOPT_POSTFIELDS,uVar7);
    pCVar3 = this->Curl;
    uVar7 = std::__cxx11::string::c_str();
    curl_easy_setopt(pCVar3,CURLOPT_URL,uVar7);
    curl_easy_setopt(this->Curl,CURLOPT_FOLLOWLOCATION,1);
    curl_easy_setopt(this->Curl,CURLOPT_WRITEFUNCTION,
                     anon_unknown.dwarf_1ac415::curlWriteMemoryCallback);
    curl_easy_setopt(this->Curl,CURLOPT_DEBUGFUNCTION,anon_unknown.dwarf_1ac415::curlDebugCallback);
    puVar1 = &debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
    std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)puVar1);
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_3a0);
    curl_easy_setopt(this->Curl,CURLOPT_WRITEDATA,puVar1);
    curl_easy_setopt(this->Curl,CURLOPT_DEBUGDATA,local_3a0);
    curl_easy_setopt(this->Curl,CURLOPT_FAILONERROR,1);
    local_3a4 = curl_easy_perform(this->Curl);
    sVar8 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)
                       &debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                      );
    if (sVar8 != 0) {
      puVar1 = &debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
      local_3d0._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::begin
                             ((vector<char,_std::allocator<char>_> *)puVar1);
      local_3d8._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::end
                             ((vector<char,_std::allocator<char>_> *)puVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                (local_3c8,local_3d0,local_3d8,&local_3d9);
      std::__cxx11::string::operator=((string *)response,local_3c8);
      std::__cxx11::string::~string(local_3c8);
      std::allocator<char>::~allocator(&local_3d9);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_558);
      poVar5 = std::operator<<((ostream *)local_558,"Curl response: [");
      poVar5 = std::operator<<(poVar5,(string *)response);
      std::operator<<(poVar5,"]\n");
      pcVar2 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCurl.cxx"
                   ,0xee,pcVar6,false);
      std::__cxx11::string::~string((string *)(curlDebug.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_558);
    }
    sVar8 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_3a0);
    if (sVar8 != 0) {
      local_5a0._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::begin
                             ((vector<char,_std::allocator<char>_> *)local_3a0);
      local_5a8._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::end
                             ((vector<char,_std::allocator<char>_> *)local_3a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                (local_598,local_5a0,local_5a8,&local_5a9);
      std::allocator<char>::~allocator(&local_5a9);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_728);
      poVar5 = std::operator<<((ostream *)local_728,"Curl debug: [");
      poVar5 = std::operator<<(poVar5,local_598);
      std::operator<<(poVar5,"]\n");
      pcVar2 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCurl.cxx"
                   ,0xf3,pcVar6,false);
      std::__cxx11::string::~string(local_748);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_728);
      std::__cxx11::string::~string(local_598);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8c0);
    poVar5 = std::operator<<((ostream *)local_8c0,"Curl res: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_3a4);
    std::operator<<(poVar5,"\n");
    pcVar2 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCurl.cxx"
                 ,0xf5,pcVar6,false);
    std::__cxx11::string::~string(local_8e0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8c0);
    this_local._7_1_ = local_3a4 == CURLE_OK;
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_3a0);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)
               &debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_350);
    std::operator<<((ostream *)local_350,"Initialization of curl failed");
    pcVar2 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCurl.cxx"
                 ,0xd7,pcVar6,false);
    std::__cxx11::string::~string
              ((string *)
               &responseData.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    std::__cxx11::ostringstream::~ostringstream(local_350);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestCurl::HttpRequest(std::string const& url,
                              std::string const& fields,
                              std::string& response)
{
  response = "";
  cmCTestLog(this->CTest, DEBUG, "HttpRequest\n"
             << "url: " << url << "\n"
             << "fields " << fields << "\n");
  if(!this->InitCurl())
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Initialization of curl failed");
    return false;
    }
  curl_easy_setopt(this->Curl, CURLOPT_POST, 1);
  curl_easy_setopt(this->Curl, CURLOPT_POSTFIELDS, fields.c_str());
  ::curl_easy_setopt(this->Curl, CURLOPT_URL, url.c_str());
  ::curl_easy_setopt(this->Curl, CURLOPT_FOLLOWLOCATION, 1);
  //set response options
  ::curl_easy_setopt(this->Curl, CURLOPT_WRITEFUNCTION,
                     curlWriteMemoryCallback);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGFUNCTION,
        curlDebugCallback);
  std::vector<char> responseData;
  std::vector<char> debugData;
  ::curl_easy_setopt(this->Curl, CURLOPT_FILE, (void *)&responseData);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGDATA, (void *)&debugData);
  ::curl_easy_setopt(this->Curl, CURLOPT_FAILONERROR, 1);

  CURLcode res = ::curl_easy_perform(this->Curl);

  if ( responseData.size() > 0 )
    {
    response = std::string(responseData.begin(), responseData.end());
    cmCTestLog(this->CTest, DEBUG, "Curl response: [" << response << "]\n");
    }
  if ( debugData.size() > 0 )
    {
    std::string curlDebug = std::string(debugData.begin(), debugData.end());
    cmCTestLog(this->CTest, DEBUG, "Curl debug: [" << curlDebug << "]\n");
    }
  cmCTestLog(this->CTest, DEBUG, "Curl res: " << res << "\n");
  return (res == 0);
}